

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

ssize_t archive_write_mtree_data(archive_write *a,void *buff,size_t n)

{
  mtree_writer *mtree_00;
  mtree_writer *mtree;
  size_t n_local;
  void *buff_local;
  archive_write *a_local;
  
  mtree_00 = (mtree_writer *)a->format_data;
  mtree = (mtree_writer *)n;
  if (mtree_00->entry_bytes_remaining < n) {
    mtree = (mtree_writer *)mtree_00->entry_bytes_remaining;
  }
  mtree_00->entry_bytes_remaining = mtree_00->entry_bytes_remaining - (long)mtree;
  if ((mtree_00->mtree_entry != (mtree_entry_conflict *)0x0) &&
     (mtree_00->mtree_entry->filetype == 0x8000)) {
    sum_update(mtree_00,buff,(size_t)mtree);
  }
  return (ssize_t)mtree;
}

Assistant:

static ssize_t
archive_write_mtree_data(struct archive_write *a, const void *buff, size_t n)
{
	struct mtree_writer *mtree= a->format_data;

	if (n > mtree->entry_bytes_remaining)
		n = (size_t)mtree->entry_bytes_remaining;
	mtree->entry_bytes_remaining -= n;

	/* We don't need to compute a regular file sum */
	if (mtree->mtree_entry == NULL)
		return (n);

	if (mtree->mtree_entry->filetype == AE_IFREG)
		sum_update(mtree, buff, n);

	return (n);
}